

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::getTimingTagsKernel
          (CLIntercept *this,cl_command_queue queue,cl_kernel kernel,cl_uint workDim,size_t *gwo,
          size_t *gws,size_t *lws,string *hostTag,string *deviceTag)

{
  mutex *__mutex;
  _Rb_tree_header *p_Var1;
  cl_api_clGetKernelSubGroupInfo p_Var2;
  cl_platform_id platform_00;
  _Alloc_hider platform_01;
  int iVar3;
  cl_int cVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  undefined8 uVar8;
  size_t sVar9;
  _Base_ptr p_Var10;
  size_t *psVar11;
  cl_uint cVar12;
  ulong uVar13;
  CLdispatchXMap *this_00;
  CLdispatchXMap *pCVar14;
  bool bVar15;
  cl_device_id device;
  cl_platform_id platform;
  _cl_platform_id local_230 [16];
  CLdispatchXMap *local_220;
  size_t *local_218;
  size_t *local_210;
  cl_uint local_204;
  size_t *local_200;
  size_t maxsgs;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  cl_command_queue local_1e0;
  size_t pwgsm;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  CLdispatchXMap *local_1b8;
  size_t kwgs;
  ostringstream ss;
  _cl_platform_id local_198 [96];
  ios_base local_138 [264];
  
  __mutex = &this->m_Mutex;
  local_218 = gwo;
  local_210 = gws;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    uVar8 = std::__throw_system_error(iVar3);
    if ((_cl_platform_id *)_ss != local_198) {
      operator_delete(_ss);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar8);
  }
  device = (cl_device_id)0x0;
  local_1e0 = queue;
  (*(this->m_Dispatch).clGetCommandQueueInfo)(queue,0x1091,8,&device,(size_t *)0x0);
  cacheDeviceInfo(this,device);
  if (kernel == (cl_kernel)0x0) goto LAB_00178c5d;
  getShortKernelNameWithHash_abi_cxx11_((string *)&ss,this,kernel);
  std::__cxx11::string::_M_append((char *)hostTag,(ulong)_ss);
  if ((_cl_platform_id *)_ss != local_198) {
    operator_delete(_ss);
  }
  std::__cxx11::string::_M_append((char *)deviceTag,(ulong)(hostTag->_M_dataplus)._M_p);
  local_200 = lws;
  if (((this->m_Config).DevicePerformanceTimeKernelInfoTracking == true) &&
     (device != (cl_device_id)0x0)) {
    pmVar5 = std::
             map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
             ::operator[](&this->m_DeviceInfoMap,&device);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    maxsgs = 0;
    pwgsm = 0;
    kwgs = 0;
    pCVar14 = (CLdispatchXMap *)lws;
    cVar12 = workDim;
    if (lws == (size_t *)0x0) {
      pCVar14 = (CLdispatchXMap *)&kwgs;
      (*(this->m_Dispatch).clGetKernelWorkGroupInfo)(kernel,device,0x11b0,8,pCVar14,(size_t *)0x0);
      cVar12 = 1;
      if (maxsgs == 0) goto LAB_00178107;
    }
    else {
LAB_00178107:
      if (pmVar5->Supports_cl_khr_subgroups == true) {
        platform = (cl_platform_id)0x0;
        local_220 = pCVar14;
        local_204 = cVar12;
        (*(this->m_Dispatch).clGetDeviceInfo)(device,0x1031,8,&platform,(size_t *)0x0);
        platform_00 = platform;
        this_00 = &this->m_DispatchX;
        p_Var10 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = &p_Var1->_M_header;
        if (p_Var10 == (_Base_ptr)0x0) {
LAB_00178189:
          platform = (cl_platform_id)0x0;
          pmVar6 = std::
                   map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                   ::at(this_00,&platform);
        }
        else {
          do {
            if (*(cl_platform_id *)(p_Var10 + 1) >= platform) {
              p_Var7 = p_Var10;
            }
            p_Var10 = (&p_Var10->_M_left)[*(cl_platform_id *)(p_Var10 + 1) < platform];
          } while (p_Var10 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var7 == p_Var1) || (platform < *(cl_platform_id *)(p_Var7 + 1)))
          goto LAB_00178189;
          pmVar6 = (mapped_type *)&p_Var7[1]._M_parent;
        }
        pCVar14 = local_220;
        if (pmVar6->clGetKernelSubGroupInfoKHR ==
            (_func_cl_int_cl_kernel_cl_device_id_cl_kernel_sub_group_info_size_t_void_ptr_size_t_void_ptr_size_t_ptr
             *)0x0) {
          platform = local_230;
          local_1b8 = this_00;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&platform,"clGetKernelSubGroupInfoKHR","");
          getExtensionFunctionAddress(this,platform_00,(string *)&platform);
          this_00 = local_1b8;
          if (platform != local_230) {
            operator_delete(platform);
            this_00 = local_1b8;
          }
        }
        p_Var10 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = &p_Var1->_M_header;
        if (p_Var10 == (_Base_ptr)0x0) {
LAB_00178239:
          platform = (cl_platform_id)0x0;
          pmVar6 = std::
                   map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                   ::at(this_00,&platform);
        }
        else {
          do {
            if (*(cl_platform_id *)(p_Var10 + 1) >= platform_00) {
              p_Var7 = p_Var10;
            }
            p_Var10 = (&p_Var10->_M_left)[*(cl_platform_id *)(p_Var10 + 1) < platform_00];
          } while (p_Var10 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var7 == p_Var1) ||
             (platform_00 < (cl_platform_id)((_Rb_tree_header *)p_Var7)->_M_node_count))
          goto LAB_00178239;
          pmVar6 = (mapped_type *)((long)p_Var7 + 0x28);
        }
        cVar12 = local_204;
        if (pmVar6->clGetKernelSubGroupInfoKHR !=
            (_func_cl_int_cl_kernel_cl_device_id_cl_kernel_sub_group_info_size_t_void_ptr_size_t_void_ptr_size_t_ptr
             *)0x0) {
          (*pmVar6->clGetKernelSubGroupInfoKHR)
                    (kernel,device,0x2033,(ulong)local_204 << 3,pCVar14,8,&maxsgs,(size_t *)0x0);
        }
      }
    }
    if (((maxsgs == 0) && (0x800fff < pmVar5->NumericVersion)) &&
       (p_Var2 = (this->m_Dispatch).clGetKernelSubGroupInfo,
       p_Var2 != (cl_api_clGetKernelSubGroupInfo)0x0)) {
      (*p_Var2)(kernel,device,0x2033,(ulong)cVar12 << 3,pCVar14,8,&maxsgs,(size_t *)0x0);
    }
    (*(this->m_Dispatch).clGetKernelWorkGroupInfo)(kernel,device,0x11b3,8,&pwgsm,(size_t *)0x0);
    sVar9 = maxsgs;
    if (maxsgs == 0) {
      sVar9 = pwgsm;
    }
    if (pwgsm == 0) {
      pwgsm = maxsgs;
    }
    uVar13 = pwgsm;
    if (sVar9 < pwgsm) {
      uVar13 = sVar9;
    }
    maxsgs = sVar9;
    if (uVar13 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," SIMD",5);
      std::ostream::_M_insert<unsigned_long>((ulong)&ss);
    }
    platform = (cl_platform_id)((ulong)platform & 0xffffffff00000000);
    (*(this->m_Dispatch).clGetKernelWorkGroupInfo)(kernel,device,0x425b,4,&platform,(size_t *)0x0);
    if ((int)platform != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," REG",4);
      std::ostream::_M_insert<unsigned_long>((ulong)&ss);
    }
    platform = (cl_platform_id)0x0;
    (*(this->m_Dispatch).clGetKernelWorkGroupInfo)(kernel,device,0x11b2,8,&platform,(size_t *)0x0);
    if (platform != (cl_platform_id)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," SLM=",5);
      std::ostream::_M_insert<unsigned_long>((ulong)&ss);
    }
    platform = (cl_platform_id)0x0;
    (*(this->m_Dispatch).clGetKernelWorkGroupInfo)(kernel,device,0x11b4,8,&platform,(size_t *)0x0);
    if (platform != (cl_platform_id)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," TPM=",5);
      std::ostream::_M_insert<unsigned_long>((ulong)&ss);
    }
    platform = (cl_platform_id)0x0;
    (*(this->m_Dispatch).clGetKernelWorkGroupInfo)(kernel,device,0x4109,8,&platform,(size_t *)0x0);
    if (platform != (cl_platform_id)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," SPILL=",7);
      std::ostream::_M_insert<unsigned_long>((ulong)&ss);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)deviceTag,(ulong)platform);
    if (platform != local_230) {
      operator_delete(platform);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
    std::ios_base::~ios_base(local_138);
  }
  if ((this->m_Config).DevicePerformanceTimeGWOTracking == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," GWO[ ",6);
    if (local_218 == (size_t *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,"NULL",4);
    }
    else if ((workDim != 0) && (std::ostream::_M_insert<unsigned_long>((ulong)&ss), workDim != 1)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,", ",2);
      std::ostream::_M_insert<unsigned_long>((ulong)&ss);
      if (2 < workDim) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,", ",2);
        std::ostream::_M_insert<unsigned_long>((ulong)&ss);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," ]",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)deviceTag,(ulong)platform);
    if (platform != local_230) {
      operator_delete(platform);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
    std::ios_base::~ios_base(local_138);
  }
  if ((local_210 != (size_t *)0x0) && ((this->m_Config).DevicePerformanceTimeGWSTracking != false))
  {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," GWS[ ",6);
    if ((workDim != 0) && (std::ostream::_M_insert<unsigned_long>((ulong)&ss), workDim != 1)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," x ",3);
      std::ostream::_M_insert<unsigned_long>((ulong)&ss);
      if (2 < workDim) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," x ",3);
        std::ostream::_M_insert<unsigned_long>((ulong)&ss);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," ]",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)deviceTag,(ulong)platform);
    if (platform != local_230) {
      operator_delete(platform);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
    std::ios_base::~ios_base(local_138);
  }
  if ((this->m_Config).DevicePerformanceTimeLWSTracking != true) goto LAB_00178c5d;
  maxsgs = 0;
  uStack_1f0 = 0;
  bVar15 = false;
  local_1e8 = 0;
  local_1c8 = 0;
  pwgsm = 0;
  uStack_1d0 = 0;
  if (workDim < 4 && lws == (size_t *)0x0) {
    if ((this->m_Config).DevicePerformanceTimeSuggestedLWSTracking == true) {
      _ss = (pointer)0x0;
      (*(this->m_Dispatch).clGetDeviceInfo)(device,0x1031,8,&ss,(size_t *)0x0);
      platform_01._M_p = _ss;
      local_220 = &this->m_DispatchX;
      p_Var10 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = &p_Var1->_M_header;
      if (p_Var10 == (_Base_ptr)0x0) {
LAB_001788b8:
        _ss = (pointer)0x0;
        pmVar6 = std::
                 map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                 ::at(local_220,(key_type *)&ss);
      }
      else {
        do {
          if (*(cl_platform_id *)(p_Var10 + 1) >= _ss) {
            p_Var7 = p_Var10;
          }
          p_Var10 = (&p_Var10->_M_left)[*(cl_platform_id *)(p_Var10 + 1) < _ss];
        } while (p_Var10 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 == p_Var1) || (_ss < *(cl_platform_id *)(p_Var7 + 1)))
        goto LAB_001788b8;
        pmVar6 = (mapped_type *)&p_Var7[1]._M_parent;
      }
      if (pmVar6->clGetKernelSuggestedLocalWorkSizeKHR ==
          (_func_cl_int_cl_command_queue_cl_kernel_cl_uint_size_t_ptr_size_t_ptr_size_t_ptr *)0x0) {
        _ss = (pointer)local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&ss,"clGetKernelSuggestedLocalWorkSizeKHR","");
        getExtensionFunctionAddress(this,(cl_platform_id)platform_01._M_p,(string *)&ss);
        if ((_cl_platform_id *)_ss != local_198) {
          operator_delete(_ss);
        }
      }
      p_Var10 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      if (p_Var10 == (_Base_ptr)0x0) {
LAB_00178963:
        _ss = (pointer)0x0;
        pmVar6 = std::
                 map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                 ::at(local_220,(key_type *)&ss);
      }
      else {
        do {
          if (*(cl_platform_id *)(p_Var10 + 1) >= platform_01._M_p) {
            p_Var7 = p_Var10;
          }
          p_Var10 = (&p_Var10->_M_left)[*(cl_platform_id *)(p_Var10 + 1) < platform_01._M_p];
        } while (p_Var10 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 == p_Var1) ||
           (platform_01._M_p < (cl_platform_id)((_Rb_tree_header *)p_Var7)->_M_node_count))
        goto LAB_00178963;
        pmVar6 = (mapped_type *)((long)p_Var7 + 0x28);
      }
      if ((pmVar6->clGetKernelSuggestedLocalWorkSizeKHR !=
           (_func_cl_int_cl_command_queue_cl_kernel_cl_uint_size_t_ptr_size_t_ptr_size_t_ptr *)0x0)
         && (cVar4 = (*pmVar6->clGetKernelSuggestedLocalWorkSizeKHR)
                               (local_1e0,kernel,workDim,local_218,local_210,&maxsgs), cVar4 == 0))
      {
        bVar15 = true;
        goto LAB_00178aeb;
      }
      p_Var10 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      if (p_Var10 == (_Base_ptr)0x0) {
LAB_001789e2:
        _ss = (pointer)0x0;
        pmVar6 = std::
                 map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                 ::at(local_220,(key_type *)&ss);
      }
      else {
        do {
          if (*(cl_platform_id *)(p_Var10 + 1) >= platform_01._M_p) {
            p_Var7 = p_Var10;
          }
          p_Var10 = (&p_Var10->_M_left)[*(cl_platform_id *)(p_Var10 + 1) < platform_01._M_p];
        } while (p_Var10 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 == p_Var1) ||
           (platform_01._M_p < (cl_platform_id)((_Rb_tree_header *)p_Var7)->_M_node_count))
        goto LAB_001789e2;
        pmVar6 = (mapped_type *)((long)p_Var7 + 0x28);
      }
      if (pmVar6->clGetKernelSuggestedLocalWorkSizeINTEL ==
          (_func_cl_int_cl_command_queue_cl_kernel_cl_uint_size_t_ptr_size_t_ptr_size_t_ptr *)0x0) {
        _ss = (pointer)local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&ss,"clGetKernelSuggestedLocalWorkSizeINTEL","");
        getExtensionFunctionAddress(this,(cl_platform_id)platform_01._M_p,(string *)&ss);
        if ((_cl_platform_id *)_ss != local_198) {
          operator_delete(_ss);
        }
      }
      p_Var10 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      if (p_Var10 == (_Base_ptr)0x0) {
LAB_00178a8d:
        _ss = (pointer)0x0;
        pmVar6 = std::
                 map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                 ::at(local_220,(key_type *)&ss);
      }
      else {
        do {
          if (*(cl_platform_id *)(p_Var10 + 1) >= platform_01._M_p) {
            p_Var7 = p_Var10;
          }
          p_Var10 = (&p_Var10->_M_left)[*(cl_platform_id *)(p_Var10 + 1) < platform_01._M_p];
        } while (p_Var10 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 == p_Var1) ||
           (platform_01._M_p < (cl_platform_id)((_Rb_tree_header *)p_Var7)->_M_node_count))
        goto LAB_00178a8d;
        pmVar6 = (mapped_type *)((long)p_Var7 + 0x28);
      }
      if (pmVar6->clGetKernelSuggestedLocalWorkSizeINTEL !=
          (_func_cl_int_cl_command_queue_cl_kernel_cl_uint_size_t_ptr_size_t_ptr_size_t_ptr *)0x0) {
        psVar11 = &pwgsm;
        if (local_218 != (size_t *)0x0) {
          psVar11 = local_218;
        }
        cVar4 = (*pmVar6->clGetKernelSuggestedLocalWorkSizeINTEL)
                          (local_1e0,kernel,workDim,psVar11,local_210,&maxsgs);
        bVar15 = cVar4 == 0;
        goto LAB_00178aeb;
      }
    }
    bVar15 = false;
  }
LAB_00178aeb:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  if (bVar15) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," SLWS[ ",7);
    local_200 = &maxsgs;
LAB_00178b49:
    if ((workDim != 0) && (std::ostream::_M_insert<unsigned_long>((ulong)&ss), workDim != 1)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," x ",3);
      std::ostream::_M_insert<unsigned_long>((ulong)&ss);
      if (2 < workDim) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," x ",3);
        std::ostream::_M_insert<unsigned_long>((ulong)&ss);
      }
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," LWS[ ",6);
    if (lws != (size_t *)0x0) goto LAB_00178b49;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,"NULL",4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," ]",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)deviceTag,(ulong)platform);
  if (platform != local_230) {
    operator_delete(platform);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  std::ios_base::~ios_base(local_138);
LAB_00178c5d:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void CLIntercept::getTimingTagsKernel(
    const cl_command_queue queue,
    const cl_kernel kernel,
    const cl_uint workDim,
    const size_t* gwo,
    const size_t* gws,
    const size_t* lws,
    std::string& hostTag,
    std::string& deviceTag )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_device_id device = NULL;
    dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_DEVICE,
        sizeof(device),
        &device,
        NULL );

    // Cache the device info if it's not cached already, since we'll print
    // the device name and other device properties as part of the report.
    cacheDeviceInfo( device );

    if( kernel )
    {
        hostTag += getShortKernelNameWithHash(kernel);

        deviceTag += hostTag;

        if( config().DevicePerformanceTimeKernelInfoTracking && device )
        {
            const SDeviceInfo& deviceInfo = m_DeviceInfoMap[device];

            std::ostringstream  ss;
            {
                size_t  maxsgs = 0;
                size_t  pwgsm = 0;
                size_t  simd = 0;

                // Use the kernel "max subgroup size" and "preferred work
                // group size multiple" to get a reasonable estimate of
                // the kernel "SIMD size".  We'll try to query both values,
                // and if both queries are successful, we'll pick the
                // smallest one.  Empirically, this is reasonably accurate.

                // First, query the "max subgroup size":

                // The query for the max subgroup size requires passing in
                // a local work size.  We'll use the local work size provided
                // by the app if there is one, otherwise we will query the
                // max local work size for this kernel and use it.
                const size_t*   queryLWS = lws;
                cl_uint queryWorkDim = workDim;

                size_t  kwgs = 0;
                if( queryLWS == NULL )
                {
                    dispatch().clGetKernelWorkGroupInfo(
                        kernel,
                        device,
                        CL_KERNEL_WORK_GROUP_SIZE,
                        sizeof(kwgs),
                        &kwgs,
                        NULL );
                    queryLWS = &kwgs;
                    queryWorkDim = 1;
                }

                if( maxsgs == 0 &&
                    deviceInfo.Supports_cl_khr_subgroups )
                {
                    cl_platform_id  platform = getPlatform(device);
                    if( dispatchX(platform).clGetKernelSubGroupInfoKHR == NULL )
                    {
                        getExtensionFunctionAddress(
                            platform,
                            "clGetKernelSubGroupInfoKHR" );
                    }

                    const auto& dispatchX = this->dispatchX(platform);
                    if( dispatchX.clGetKernelSubGroupInfoKHR )
                    {
                        dispatchX.clGetKernelSubGroupInfoKHR(
                            kernel,
                            device,
                            CL_KERNEL_MAX_SUB_GROUP_SIZE_FOR_NDRANGE_KHR,
                            queryWorkDim * sizeof(queryLWS[0]),
                            queryLWS,
                            sizeof(maxsgs),
                            &maxsgs,
                            NULL );
                    }
                }
                if( maxsgs == 0 &&
                    deviceInfo.NumericVersion >= CL_MAKE_VERSION_KHR(2, 1, 0) &&
                    dispatch().clGetKernelSubGroupInfo )
                {
                    dispatch().clGetKernelSubGroupInfo(
                        kernel,
                        device,
                        CL_KERNEL_MAX_SUB_GROUP_SIZE_FOR_NDRANGE,
                        queryWorkDim * sizeof(queryLWS[0]),
                        queryLWS,
                        sizeof(maxsgs),
                        &maxsgs,
                        NULL );
                }

                // Next, query the "preferred work group size multiple":

                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_PREFERRED_WORK_GROUP_SIZE_MULTIPLE,
                    sizeof(pwgsm),
                    &pwgsm,
                    NULL );

                // If either query is zero, use the other query.
                // Otherwise, use the smallest query.

                maxsgs = ( maxsgs == 0 ) ? pwgsm : maxsgs;
                pwgsm = ( pwgsm == 0 ) ? maxsgs : pwgsm;
                simd = ( maxsgs < pwgsm ) ? maxsgs : pwgsm;

                if( simd )
                {
                    ss << " SIMD" << simd;
                }
            }
            {
                cl_uint regCount = 0;
                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_REGISTER_COUNT_INTEL,
                    sizeof(regCount),
                    &regCount,
                    NULL );
                if( regCount )
                {
                    ss << " REG" << regCount;
                }
            }
            {
                cl_ulong slm = 0;
                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_LOCAL_MEM_SIZE,
                    sizeof(slm),
                    &slm,
                    NULL );
                if( slm )
                {
                    ss << " SLM=" << slm;
                }
            }
            {
                cl_ulong tpm = 0;
                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_PRIVATE_MEM_SIZE,
                    sizeof(tpm),
                    &tpm,
                    NULL );
                if( tpm )
                {
                    ss << " TPM=" << tpm;
                }
            }
            {
                cl_ulong spill = 0;
                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_SPILL_MEM_SIZE_INTEL,
                    sizeof(spill),
                    &spill,
                    NULL );
                if( spill )
                {
                    ss << " SPILL=" << spill;
                }
            }
            deviceTag += ss.str();
        }

        if( config().DevicePerformanceTimeGWOTracking )
        {
            std::ostringstream  ss;
            ss << " GWO[ ";
            if( gwo )
            {
                if( workDim >= 1 )
                {
                    ss << gwo[0];
                }
                if( workDim >= 2 )
                {
                    ss << ", " << gwo[1];
                }
                if( workDim >= 3 )
                {
                    ss << ", " << gwo[2];
                }
            }
            else
            {
                ss << "NULL";
            }
            ss << " ]";
            deviceTag += ss.str();
        }

        if( config().DevicePerformanceTimeGWSTracking && gws )
        {
            std::ostringstream  ss;
            ss << " GWS[ ";
            if( workDim >= 1 )
            {
                ss << gws[0];
            }
            if( workDim >= 2 )
            {
                ss << " x " << gws[1];
            }
            if( workDim >= 3 )
            {
                ss << " x " << gws[2];
            }
            ss << " ]";
            deviceTag += ss.str();
        }

        if( config().DevicePerformanceTimeLWSTracking )
        {
            bool    useSuggestedLWS = false;
            size_t  suggestedLWS[3] = { 0, 0, 0 };
            size_t  emptyGWO[3] = { 0, 0, 0 };

            if( lws == NULL &&
                workDim <= 3 &&
                config().DevicePerformanceTimeSuggestedLWSTracking )
            {
                cl_platform_id  platform = getPlatform(device);

                // Try the cl_khr_suggested_local_work_size version first.
                if( useSuggestedLWS == false )
                {
                    if( dispatchX(platform).clGetKernelSuggestedLocalWorkSizeKHR == NULL )
                    {
                        getExtensionFunctionAddress(
                            platform,
                            "clGetKernelSuggestedLocalWorkSizeKHR" );
                    }

                    const auto& dispatchX = this->dispatchX(platform);
                    if( dispatchX.clGetKernelSuggestedLocalWorkSizeKHR )
                    {
                        cl_int testErrorCode = dispatchX.clGetKernelSuggestedLocalWorkSizeKHR(
                            queue,
                            kernel,
                            workDim,
                            gwo,
                            gws,
                            suggestedLWS );
                        useSuggestedLWS = ( testErrorCode == CL_SUCCESS );
                    }
                }

                // If this fails, try the unofficial Intel version next.
                if( useSuggestedLWS == false )
                {
                    if( dispatchX(platform).clGetKernelSuggestedLocalWorkSizeINTEL == NULL )
                    {
                        getExtensionFunctionAddress(
                            platform,
                            "clGetKernelSuggestedLocalWorkSizeINTEL" );
                    }

                    const auto& dispatchX = this->dispatchX(platform);
                    if( dispatchX.clGetKernelSuggestedLocalWorkSizeINTEL )
                    {
                        cl_int testErrorCode = dispatchX.clGetKernelSuggestedLocalWorkSizeINTEL(
                            queue,
                            kernel,
                            workDim,
                            gwo == NULL ? emptyGWO : gwo,
                            gws,
                            suggestedLWS );
                        useSuggestedLWS = ( testErrorCode == CL_SUCCESS );
                    }
                }
            }

            std::ostringstream  ss;
            if( useSuggestedLWS )
            {
                ss << " SLWS[ ";
                lws = suggestedLWS;
            }
            else
            {
                ss << " LWS[ ";
            }

            if( lws )
            {
                if( workDim >= 1 )
                {
                    ss << lws[0];
                }
                if( workDim >= 2 )
                {
                    ss << " x " << lws[1];
                }
                if( workDim >= 3 )
                {
                    ss << " x " << lws[2];
                }
            }
            else
            {
                ss << "NULL";
            }

            ss << " ]";
            deviceTag += ss.str();
        }
    }
}